

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_ignoreOtherParameters_Test::testBody
          (TEST_MockParameterTest_ignoreOtherParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  SimpleString SStack_48;
  SimpleString local_38;
  SimpleString local_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&SStack_48,"");
  pMVar2 = mock(&SStack_48,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_38,1);
  (**(code **)(*plVar3 + 0x48))(plVar3);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::SimpleString(&SStack_48,"");
  pMVar2 = mock(&SStack_48,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_28);
  SimpleString::SimpleString(&local_38,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x40))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_38,1);
  SimpleString::SimpleString(&local_18,"p2");
  (**(code **)(*plVar3 + 0x40))(plVar3,&local_18,2);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::SimpleString(&SStack_48,"");
  pMVar2 = mock(&SStack_48,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_48);
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParameters)
{
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters();
    mock().actualCall("foo").withParameter("p1", 1).withParameter("p2", 2);

    mock().checkExpectations();
}